

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O3

int byteoffset(lua_State *L)

{
  long lVar1;
  bool bVar2;
  lua_Integer lVar3;
  ulong uVar4;
  lua_Integer def;
  long lVar5;
  ulong uVar6;
  size_t len;
  ulong local_30;
  
  luaL_checklstring(L,1,&local_30);
  lVar3 = luaL_checkinteger(L,2);
  def = 1;
  if (lVar3 < 0) {
    def = local_30 + 1;
  }
  uVar4 = luaL_optinteger(L,3,def);
  if ((long)uVar4 < 0) {
    if (-uVar4 <= local_30) {
      uVar4 = uVar4 + local_30 + 1;
      goto LAB_00122834;
    }
    uVar4 = 0;
LAB_00122841:
    luaL_argerror(L,3,"position out of range");
  }
  else {
LAB_00122834:
    if (((long)uVar4 < 1) || (uVar4 = uVar4 - 1, (long)local_30 < (long)uVar4)) goto LAB_00122841;
  }
  if (lVar3 == 0) {
LAB_00122932:
    lua_pushinteger(L,uVar4 + 1);
  }
  else {
    if (lVar3 < 0) {
      uVar6 = uVar4;
      if (0 < (long)uVar4) {
        while (1 < uVar6) {
          uVar4 = uVar6 - 1;
          lVar5 = lVar3 + 1;
          if ((-2 < lVar3) || (bVar2 = (long)uVar6 < 2, lVar3 = lVar5, uVar6 = uVar4, bVar2))
          goto LAB_00122923;
        }
        lVar5 = lVar3 + 1;
        uVar4 = 0;
        goto LAB_00122923;
      }
    }
    else {
      lVar5 = lVar3 + -1;
      if (lVar3 != 1) {
        do {
          if ((long)local_30 <= (long)uVar4) break;
          uVar4 = uVar4 + 1;
          lVar1 = lVar5 + -1;
          bVar2 = 1 < lVar5;
          lVar5 = lVar1;
        } while (bVar2);
      }
LAB_00122923:
      if (lVar5 == 0) goto LAB_00122932;
    }
    lua_pushnil(L);
  }
  return 1;
}

Assistant:

static int byteoffset (lua_State *L) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Integer n  = luaL_checkinteger(L, 2);
  lua_Integer posi = (n >= 0) ? 1 : len + 1;
  posi = u_posrelat(luaL_optinteger(L, 3, posi), len);
  luaL_argcheck(L, 1 <= posi && --posi <= (lua_Integer)len, 3,
                   "position out of range");
  if (n == 0) {
    /* find beginning of current byte sequence */
    while (posi > 0 && iscont(s + posi)) posi--;
  }
  else {
    if (iscont(s + posi))
      return luaL_error(L, "initial position is a continuation byte");
    if (n < 0) {
       while (n < 0 && posi > 0) {  /* move back */
         do {  /* find beginning of previous character */
           posi--;
         } while (posi > 0 && iscont(s + posi));
         n++;
       }
     }
     else {
       n--;  /* do not move for 1st character */
       while (n > 0 && posi < (lua_Integer)len) {
         do {  /* find beginning of next character */
           posi++;
         } while (iscont(s + posi));  /* (cannot pass final '\0') */
         n--;
       }
     }
  }
  if (n == 0)  /* did it find given character? */
    lua_pushinteger(L, posi + 1);
  else  /* no such character */
    lua_pushnil(L);
  return 1;
}